

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void selectInnerLoop(Parse *pParse,Select *p,int srcTab,SortCtx *pSort,DistinctCtx *pDistinct,
                    SelectDest *pDest,int iContinue,int iBreak)

{
  ushort uVar1;
  Vdbe *p_00;
  char *zP4;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Op *pOVar12;
  ExprList *pEVar13;
  int *piVar14;
  uint uVar15;
  ExprList *pEVar16;
  u8 uVar17;
  uint p2;
  bool bVar18;
  RowLoadInfo sRowLoadInfo;
  RowLoadInfo local_38;
  
  if (pDistinct == (DistinctCtx *)0x0) {
    uVar17 = '\0';
  }
  else {
    uVar17 = pDistinct->eTnctType;
  }
  if (pSort == (SortCtx *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  else if (pSort->pOrderBy == (ExprList *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  p_00 = pParse->pVdbe;
  bVar3 = pDest->eDest;
  iVar9 = pDest->iSDParm;
  if ((uVar17 == '\0' && pSort == (SortCtx *)0x0) && (0 < p->iOffset)) {
    sqlite3VdbeAddOp3(p_00,0x3b,p->iOffset,iContinue,1);
  }
  pEVar16 = p->pEList;
  p2 = pEVar16->nExpr;
  iVar7 = pDest->iSdst;
  if (iVar7 == 0) {
    if (pSort == (SortCtx *)0x0) {
      iVar4 = pParse->nMem;
      iVar10 = 0;
    }
    else {
      iVar10 = (~*(uint *)&pSort->sortFlags & 1) + pSort->pOrderBy->nExpr;
      iVar4 = pParse->nMem + iVar10;
    }
    iVar7 = iVar4 + 1;
    pDest->iSdst = iVar7;
LAB_001991e5:
    pParse->nMem = iVar4 + p2;
  }
  else {
    iVar4 = pParse->nMem;
    iVar10 = 0;
    if (iVar4 < (int)(iVar7 + p2)) goto LAB_001991e5;
  }
  pDest->nSdst = p2;
  iVar4 = iVar7;
  if (srcTab < 0) {
    bVar2 = 1;
    uVar15 = (uint)bVar3;
    if ((1 < uVar15 - 9) && (uVar15 != 0xd)) {
      if (uVar15 == 3) goto LAB_00199351;
      bVar2 = 0;
    }
    if ((uVar17 == '\0' && pSort != (SortCtx *)0x0) && (bVar3 & 0xfd) != 0xc) {
      lVar11 = (long)pSort->nOBSat;
      pEVar13 = pSort->pOrderBy;
      iVar5 = pEVar13->nExpr;
      uVar15 = p2;
      if (pSort->nOBSat < iVar5) {
        do {
          uVar1 = pEVar13->a[lVar11].u.x.iOrderByCol;
          lVar11 = lVar11 + 1;
          if (uVar1 != 0) {
            p->pEList->a[uVar1 - 1].u.x.iOrderByCol = (short)lVar11 - (short)pSort->nOBSat;
            pEVar13 = pSort->pOrderBy;
            iVar5 = pEVar13->nExpr;
          }
        } while (lVar11 < iVar5);
        pEVar16 = p->pEList;
        uVar15 = pEVar16->nExpr;
      }
      bVar2 = bVar2 | 0xc;
      if (0 < (int)uVar15) {
        lVar11 = 0;
        do {
          bVar18 = *(short *)((long)&pEVar16->a[0].u + lVar11) != 0;
          if (bVar18) {
            iVar4 = 0;
          }
          p2 = p2 - bVar18;
          lVar11 = lVar11 + 0x18;
        } while ((ulong)uVar15 * 0x18 != lVar11);
      }
    }
    local_38.regResult = iVar7;
    local_38.ecelFlags = bVar2;
    if (((p->iLimit == 0) || ((bVar2 & 8) == 0)) || (iVar10 < 1)) {
      sqlite3ExprCodeExprList(pParse,pEVar16,iVar7,0,bVar2);
    }
    else {
      pSort->pDeferredRowLoad = &local_38;
      iVar4 = 0;
    }
  }
  else if (0 < (int)p2) {
    uVar15 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5e,srcTab,uVar15,uVar15 + iVar7);
      uVar15 = uVar15 + 1;
    } while (p2 != uVar15);
  }
LAB_00199351:
  if (uVar17 != '\0') {
    bVar2 = pDistinct->eTnctType;
    iVar5 = codeDistinct(pParse,(uint)bVar2,pDistinct->tabTnct,iContinue,p->pEList,iVar7);
    fixDistinctOpenEph(pParse,(uint)bVar2,iVar5,pDistinct->addrTnct);
    if ((pSort == (SortCtx *)0x0) && (0 < p->iOffset)) {
      sqlite3VdbeAddOp3(p_00,0x3b,p->iOffset,iContinue,1);
    }
  }
  switch(bVar3) {
  case 1:
    if (pParse->nTempReg == '\0') {
      iVar4 = pParse->nMem + 1;
      pParse->nMem = iVar4;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar4 = pParse->aTempReg[bVar3];
    }
    sqlite3VdbeAddOp3(p_00,0x61,iVar7,p2,iVar4);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x8a,iVar9,iVar4,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar12 = p_00->aOp;
      pOVar12[iVar9].p4type = -3;
      pOVar12[iVar9].p4.i = p2;
    }
    if (iVar4 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
    break;
  case 2:
    iVar4 = 0x8c;
    goto LAB_0019965e;
  case 3:
    iVar4 = 0x47;
    p2 = 0;
    iVar7 = iVar9;
    iVar9 = 1;
LAB_0019965e:
    sqlite3VdbeAddOp3(p_00,iVar4,iVar9,iVar7,p2);
    break;
  case 5:
  case 8:
  case 0xc:
  case 0xe:
    iVar5 = sqlite3GetTempRange(pParse,iVar10 + 1);
    sqlite3VdbeAddOp3(p_00,0x61,iVar7,p2,iVar5 + iVar10);
    if (pDest->zAffSdst != (char *)0x0) {
      sqlite3VdbeChangeP4(p_00,-1,pDest->zAffSdst,p2);
    }
    if (bVar3 == 5) {
      iVar6 = sqlite3VdbeAddOp3(p_00,0x1d,iVar9 + 1,p_00->nOp + 4,iVar5);
      if (p_00->db->mallocFailed == '\0') {
        pOVar12 = p_00->aOp;
        pOVar12[iVar6].p4type = -3;
        pOVar12[iVar6].p4.i = 0;
      }
      iVar7 = sqlite3VdbeAddOp3(p_00,0x8a,iVar9 + 1,iVar5,iVar7);
      if (p_00->db->mallocFailed == '\0') {
        pOVar12 = p_00->aOp;
        pOVar12[iVar7].p4type = -3;
        pOVar12[iVar7].p4.i = p2;
      }
    }
    if (pSort == (SortCtx *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar7 = pParse->nMem + 1;
        pParse->nMem = iVar7;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar7 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p_00,0x7f,iVar9,iVar7,0);
      sqlite3VdbeAddOp3(p_00,0x80,iVar9,iVar5,iVar7);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
      }
      if (iVar7 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          pParse->aTempReg[bVar3] = iVar7;
        }
      }
    }
    else {
      pushOntoSorter(pParse,pSort,p,iVar5 + iVar10,iVar4,1,iVar10);
    }
    if (iVar10 == 0) {
      if (iVar5 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          piVar14 = pParse->aTempReg + bVar3;
          goto LAB_001995dd;
        }
      }
    }
    else if (pParse->nRangeReg <= iVar10) {
      pParse->nRangeReg = iVar10 + 1;
      piVar14 = &pParse->iRangeReg;
LAB_001995dd:
      *piVar14 = iVar5;
    }
    break;
  case 6:
  case 7:
    pEVar16 = pDest->pOrderBy;
    uVar15 = pEVar16->nExpr;
    if (pParse->nTempReg == '\0') {
      iVar4 = pParse->nMem + 1;
      pParse->nMem = iVar4;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar4 = pParse->aTempReg[bVar2];
    }
    iVar5 = uVar15 + 2;
    iVar10 = sqlite3GetTempRange(pParse,iVar5);
    iVar6 = iVar10 + uVar15 + 1;
    if (bVar3 == 6) {
      iVar8 = sqlite3VdbeAddOp3(p_00,0x1d,iVar9 + 1,0,iVar7);
      if (p_00->db->mallocFailed == '\0') {
        pOVar12 = p_00->aOp;
        pOVar12[iVar8].p4type = -3;
        pOVar12[iVar8].p4.i = p2;
      }
      sqlite3VdbeAddOp3(p_00,0x61,iVar7,p2,iVar6);
      sqlite3VdbeAddOp3(p_00,0x8a,iVar9 + 1,iVar6,0);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 0x10;
      }
    }
    else {
      sqlite3VdbeAddOp3(p_00,0x61,iVar7,p2,iVar6);
      iVar8 = 0;
    }
    if (0 < (int)uVar15) {
      lVar11 = 0;
      iVar6 = iVar10;
      do {
        sqlite3VdbeAddOp3(p_00,0x51,(uint)*(ushort *)((long)&pEVar16->a[0].u + lVar11) + iVar7 + -1,
                          iVar6,0);
        iVar6 = iVar6 + 1;
        lVar11 = lVar11 + 0x18;
      } while ((ulong)uVar15 * 0x18 != lVar11);
    }
    sqlite3VdbeAddOp3(p_00,0x7e,iVar9,uVar15 + iVar10,0);
    sqlite3VdbeAddOp3(p_00,0x61,iVar10,iVar5,iVar4);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x8a,iVar9,iVar4,iVar10);
    if (p_00->db->mallocFailed == '\0') {
      pOVar12 = p_00->aOp;
      pOVar12[iVar9].p4type = -3;
      pOVar12[iVar9].p4.i = iVar5;
    }
    if (iVar8 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        pOVar12 = p_00->aOp + iVar8;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar12->p2 = p_00->nOp;
    }
    if (iVar4 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
    if (iVar5 == 1) {
      if (iVar10 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          piVar14 = pParse->aTempReg + bVar3;
          goto LAB_00199991;
        }
      }
    }
    else if (pParse->nRangeReg < iVar5) {
      pParse->nRangeReg = iVar5;
      piVar14 = &pParse->iRangeReg;
LAB_00199991:
      *piVar14 = iVar10;
    }
    break;
  case 9:
  case 0xd:
    if (pSort != (SortCtx *)0x0) {
LAB_001996a5:
      pushOntoSorter(pParse,pSort,p,iVar7,iVar4,p2,iVar10);
      return;
    }
    if (bVar3 == 0xd) {
      iVar4 = 0xc;
      uVar15 = 0;
      iVar9 = pDest->iSDParm;
    }
    else {
      iVar4 = 0x54;
      uVar15 = p2;
      iVar9 = iVar7;
    }
    iVar7 = 0;
LAB_00199a55:
    sqlite3VdbeAddOp3(p_00,iVar4,iVar9,uVar15,iVar7);
    goto LAB_00199a17;
  case 10:
    if (pSort != (SortCtx *)0x0) goto LAB_001996a5;
    goto LAB_00199a17;
  case 0xb:
    if (pSort != (SortCtx *)0x0) goto LAB_001996a5;
    if (pParse->nTempReg == '\0') {
      iVar4 = pParse->nMem + 1;
      pParse->nMem = iVar4;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar4 = pParse->aTempReg[bVar3];
    }
    zP4 = pDest->zAffSdst;
    iVar10 = sqlite3VdbeAddOp3(p_00,0x61,iVar7,p2,iVar4);
    sqlite3VdbeChangeP4(p_00,iVar10,zP4,p2);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x8a,iVar9,iVar4,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar12 = p_00->aOp;
      pOVar12[iVar9].p4type = -3;
      pOVar12[iVar9].p4.i = p2;
    }
    if (iVar4 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
    goto LAB_00199a17;
  case 0xf:
    if (pSort != (SortCtx *)0x0) goto LAB_001996a5;
    iVar4 = pDest->iSDParm2;
    if (pParse->nTempReg == '\0') {
      uVar15 = pParse->nMem + 1;
      pParse->nMem = uVar15;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      uVar15 = pParse->aTempReg[bVar3];
    }
    sqlite3VdbeAddOp3(p_00,0x32,iVar7,iBreak,0);
    sqlite3VdbeAddOp3(p_00,0x61,iVar7 - (iVar4 >> 0x1f),p2 + (iVar4 >> 0x1f),uVar15);
    if (iVar4 < 0) {
      iVar4 = 0x80;
      goto LAB_00199a55;
    }
    iVar9 = sqlite3VdbeAddOp3(p_00,0x8a,iVar9,uVar15,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar12 = p_00->aOp;
      pOVar12[iVar9].p4type = -3;
      pOVar12[iVar9].p4.i = iVar4;
    }
    goto LAB_00199a17;
  }
  if (pSort == (SortCtx *)0x0) {
LAB_00199a17:
    if (p->iLimit != 0) {
      sqlite3VdbeAddOp3(p_00,0x3d,p->iLimit,iBreak,0);
    }
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  int srcTab,             /* Pull data from this table if non-negative */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */
  RowLoadInfo sRowLoadInfo;   /* Info for deferred row loading */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( p->pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = p->pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", p->pEList->a[i].zEName));
    }
  }else if( eDest!=SRT_Exists ){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    ExprList *pExtra = 0;
#endif
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;    /* "ecel" is an abbreviation of "ExprCodeExprList" */
    ExprList *pEList;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in p->pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated
      ** iOrderByCol value to one more than the index of the ORDER BY
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the p->pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);

      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          p->pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
      selectExprDefer(pParse, pSort, p->pEList, &pExtra);
      if( pExtra && pParse->db->mallocFailed==0 ){
        /* If there are any extra PK columns to add to the sorter records,
        ** allocate extra memory cells and adjust the OpenEphemeral
        ** instruction to account for the larger records. This is only
        ** required if there are one or more WITHOUT ROWID tables with
        ** composite primary keys in the SortCtx.aDefer[] array.  */
        VdbeOp *pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
        pOp->p2 += (pExtra->nExpr - pSort->nDefer);
        pOp->p4.pKeyInfo->nAllField += (pExtra->nExpr - pSort->nDefer);
        pParse->nMem += pExtra->nExpr;
      }
#endif

      /* Adjust nResultCol to account for columns that are omitted
      ** from the sorter by the optimizations in this branch */
      pEList = p->pEList;
      for(i=0; i<pEList->nExpr; i++){
        if( pEList->a[i].u.x.iOrderByCol>0
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
         || pEList->a[i].fg.bSorterRef
#endif
        ){
          nResultCol--;
          regOrig = 0;
        }
      }

      testcase( regOrig );
      testcase( eDest==SRT_Set );
      testcase( eDest==SRT_Mem );
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      assert( eDest==SRT_Set || eDest==SRT_Mem
           || eDest==SRT_Coroutine || eDest==SRT_Output
           || eDest==SRT_Upfrom );
    }
    sRowLoadInfo.regResult = regResult;
    sRowLoadInfo.ecelFlags = ecelFlags;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    sRowLoadInfo.pExtra = pExtra;
    sRowLoadInfo.regExtraResult = regResult + nResultCol;
    if( pExtra ) nResultCol += pExtra->nExpr;
#endif
    if( p->iLimit
     && (ecelFlags & SQLITE_ECEL_OMITREF)!=0
     && nPrefixReg>0
    ){
      assert( pSort!=0 );
      assert( hasDistinct==0 );
      pSort->pDeferredRowLoad = &sRowLoadInfo;
      regOrig = 0;
    }else{
      innerLoopLoadRow(pParse, p, &sRowLoadInfo);
    }
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    int eType = pDistinct->eTnctType;
    int iTab = pDistinct->tabTnct;
    assert( nResultCol==p->pEList->nExpr );
    iTab = codeDistinct(pParse, eType, iTab, iContinue, p->pEList, regResult);
    fixDistinctOpenEph(pParse, eType, iTab, pDistinct->addrTnct);
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
      if( pDest->zAffSdst ){
        sqlite3VdbeChangeP4(v, -1, pDest->zAffSdst, nResultCol);
      }
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        assert( regResult==regOrig );
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg, regOrig, 1, nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

    case SRT_Upfrom: {
      if( pSort ){
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int i2 = pDest->iSDParm2;
        int r1 = sqlite3GetTempReg(pParse);

        /* If the UPDATE FROM join is an aggregate that matches no rows, it
        ** might still be trying to return one row, because that is what
        ** aggregates do.  Don't record that empty row in the output table. */
        sqlite3VdbeAddOp2(v, OP_IsNull, regResult, iBreak); VdbeCoverage(v);

        sqlite3VdbeAddOp3(v, OP_MakeRecord,
                          regResult+(i2<0), nResultCol-(i2<0), r1);
        if( i2<0 ){
          sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, regResult);
        }else{
          sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, i2);
        }
      }
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol,
            r1, pDest->zAffSdst, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }


    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0,
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}